

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O0

SqueezeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_squeeze(NeuralNetworkLayer *this)

{
  bool bVar1;
  SqueezeLayerParams *this_00;
  NeuralNetworkLayer *this_local;
  
  bVar1 = has_squeeze(this);
  if (!bVar1) {
    clear_layer(this);
    set_has_squeeze(this);
    this_00 = (SqueezeLayerParams *)operator_new(0x30);
    SqueezeLayerParams::SqueezeLayerParams(this_00);
    (this->layer_).squeeze_ = this_00;
  }
  return (SqueezeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::SqueezeLayerParams* NeuralNetworkLayer::mutable_squeeze() {
  if (!has_squeeze()) {
    clear_layer();
    set_has_squeeze();
    layer_.squeeze_ = new ::CoreML::Specification::SqueezeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.squeeze)
  return layer_.squeeze_;
}